

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

unqlite_col_record * CollectionCacheFetchRecord(unqlite_col *pCol,jx9_int64 nId)

{
  unqlite_col_record *puVar1;
  unqlite_col_record **ppuVar2;
  
  if (pCol->nRec != 0) {
    ppuVar2 = pCol->apRecord + ((uint)nId & pCol->nRecSize - 1);
    while (puVar1 = *ppuVar2, puVar1 != (unqlite_col_record *)0x0) {
      if (puVar1->nId == nId) {
        return puVar1;
      }
      ppuVar2 = &puVar1->pNextCol;
    }
  }
  return (unqlite_col_record *)0x0;
}

Assistant:

static unqlite_col_record * CollectionCacheFetchRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId      /* Unique record ID */
	)
{
	unqlite_col_record *pEntry;
	if( pCol->nRec < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	pEntry = pCol->apRecord[COL_RECORD_HASH(nId) & (pCol->nRecSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nId == nId ){
			/* Record found */
			return pEntry;
		}
		/* Point to the next entry */
		pEntry = pEntry->pNextCol;

	}
	/* No such record */
	return 0;
}